

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump2.cpp
# Opt level: O2

void usage(void)

{
  puts(
      "Usage: dump2 [opt] <infile> [outfile]\n        -b BASE    -- what offset to give the start of the file.\n        -o START   -- where to start dumping\n        -e END     -- where to end dumping\n        -l SIZE    -- how many bytes to dump\n        -w WIDTH   -- nr of items per line\n        -s STEP    -- how many bytes to skip between lines\n        -f         -- don\'t summarize, full dump\n        -S THRESH  -- summarize threshold\n        -x         -- only hex\n        -xx        -- only ascii\n        -1, -2, -4, -8  -- wordsize"
      );
  return;
}

Assistant:

void usage()
{
    printf(R"TEXT(Usage: dump2 [opt] <infile> [outfile]
        -b BASE    -- what offset to give the start of the file.
        -o START   -- where to start dumping
        -e END     -- where to end dumping
        -l SIZE    -- how many bytes to dump
        -w WIDTH   -- nr of items per line
        -s STEP    -- how many bytes to skip between lines
        -f         -- don't summarize, full dump
        -S THRESH  -- summarize threshold
        -x         -- only hex
        -xx        -- only ascii
        -1, -2, -4, -8  -- wordsize
)TEXT");
}